

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FieldDescriptor * __thiscall google::protobuf::Descriptor::map_key(Descriptor *this)

{
  bool bVar1;
  int iVar2;
  MessageOptions *this_00;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  Descriptor *local_18;
  Descriptor *this_local;
  
  local_18 = this;
  this_00 = options(this);
  bVar1 = MessageOptions::map_entry(this_00);
  if (bVar1) {
    iVar2 = field_count(this);
    local_51 = 0;
    if (iVar2 != 2) {
      internal::LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                 ,0x912);
      local_51 = 1;
      other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (field_count()) == (2): ");
      internal::LogFinisher::operator=(local_65,other);
    }
    if ((local_51 & 1) != 0) {
      internal::LogMessage::~LogMessage(&local_50);
    }
    this_local = (Descriptor *)field(this,0);
  }
  else {
    this_local = (Descriptor *)0x0;
  }
  return (FieldDescriptor *)this_local;
}

Assistant:

const FieldDescriptor* Descriptor::map_key() const {
  if (!options().map_entry()) return nullptr;
  GOOGLE_DCHECK_EQ(field_count(), 2);
  return field(0);
}